

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matrix.c
# Opt level: O0

void floor_nz_3d(float32 ***m,uint32 d1,uint32 d2,uint32 d3,float32 floor)

{
  uint local_2c;
  uint local_28;
  uint32 k;
  uint32 j;
  uint32 i;
  float32 floor_local;
  uint32 d3_local;
  uint32 d2_local;
  uint32 d1_local;
  float32 ***m_local;
  
  for (k = 0; k < d1; k = k + 1) {
    for (local_28 = 0; local_28 < d2; local_28 = local_28 + 1) {
      for (local_2c = 0; local_2c < d3; local_2c = local_2c + 1) {
        if ((((float)m[k][local_28][local_2c] != 0.0) || (NAN((float)m[k][local_28][local_2c]))) &&
           ((float)m[k][local_28][local_2c] < (float)floor)) {
          m[k][local_28][local_2c] = floor;
        }
      }
    }
  }
  return;
}

Assistant:

void
floor_nz_3d(float32 ***m,
	    uint32 d1,
	    uint32 d2,
	    uint32 d3,
	    float32 floor)
{
    uint32 i, j, k;

    for (i = 0; i < d1; i++) {
	for (j = 0; j < d2; j++) {
	    for (k = 0; k < d3; k++) {
		if ((m[i][j][k] != 0) && (m[i][j][k] < floor))
		    m[i][j][k] = floor;
	    }
	}
    }
}